

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_compress_stream_start(FILE *f)

{
  int iVar1;
  stb_uint sVar2;
  stb_uchar *psVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar1 = stb__window;
  stb__out = (stb_uchar *)0x0;
  iVar5 = 0;
  stb__outfile = f;
  if (f != (FILE *)0x0) {
    xtb.size = (int)((long)stb__window * 3);
    psVar3 = (stb_uchar *)malloc((long)stb__window * 3);
    sVar2 = stb__hashsize;
    xtb.buffer = psVar3;
    if (psVar3 != (stb_uchar *)0x0) {
      uVar6 = (ulong)stb__hashsize;
      xtb.chash = (stb_uchar **)malloc(uVar6 * 8);
      if (xtb.chash == (stb_uchar **)0x0) {
        free(psVar3);
        iVar5 = 0;
      }
      else {
        for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          xtb.chash[uVar4] = (stb_uchar *)0x0;
        }
        xtb.hashmask = sVar2 - 1;
        xtb.valid = 0;
        xtb.start = 0;
        xtb.window = iVar1;
        xtb.fsize = iVar1;
        xtb.pending_literals = 0;
        xtb.total_bytes = 0;
        stb__write('W');
        if (stb__out == (stb_uchar *)0x0) {
          stb__write(0xbc);
        }
        else {
          psVar3 = stb__out + 1;
          *stb__out = 0xbc;
          stb__out = psVar3;
        }
        stb_out2(0);
        stb_out4(0);
        psVar3 = stb__out;
        if (stb__out == (stb_uchar *)0x0) {
          psVar3 = (stb_uchar *)ftell((FILE *)stb__outfile);
        }
        xtb.length_id = (int)psVar3;
        stb_out4(0);
        stb_out4(stb__window);
        stb__running_adler = 1;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int stb_compress_stream_start(FILE *f)
{
   stb__out = NULL;
   stb__outfile = f;

   if (f == NULL)
      return 0;

   if (!stb_compress_streaming_start())
      return 0;

   return 1;
}